

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O0

void __thiscall dg::DGLLVMPointsToSet::_findNextReal(DGLLVMPointsToSet *this)

{
  bool bVar1;
  long in_RDI;
  const_iterator *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined7 in_stack_ffffffffffffffb0;
  bool bVar2;
  Pointer local_40;
  Pointer local_30;
  
  while( true ) {
    pta::PointerIdPointsToSet::end
              ((PointerIdPointsToSet *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
              );
    bVar1 = pta::PointerIdPointsToSet::const_iterator::operator!=
                      ((const_iterator *)
                       CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
    bVar2 = false;
    if (bVar1) {
      local_30 = pta::PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffff98);
      bVar1 = pta::Pointer::isValid
                        ((Pointer *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      in_stack_ffffffffffffffa7 = true;
      bVar2 = (bool)in_stack_ffffffffffffffa7;
      if (bVar1) {
        local_40 = pta::PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa7 = pta::Pointer::isInvalidated(&local_40);
        bVar2 = (bool)in_stack_ffffffffffffffa7;
      }
    }
    if (bVar2 == false) break;
    pta::PointerIdPointsToSet::const_iterator::operator++
              ((const_iterator *)CONCAT17(bVar2,in_stack_ffffffffffffffb0));
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
  }
  return;
}

Assistant:

void _findNextReal() override {
        while (it != PTSet.end() &&
               (!(*it).isValid() || (*it).isInvalidated())) {
            ++it;
            ++_position;
        }
    }